

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::LiftGenVarInstanceVisitor::create_gen_var_instance
               (vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
                *generators,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
               *port_mapping)

{
  shared_ptr<kratos::Stmt> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __node_base_ptr *pp_Var1;
  ModuleInstantiationStmt *pMVar2;
  undefined8 uVar3;
  bool bVar4;
  PortDirection PVar5;
  int iVar6;
  const_reference ppMVar7;
  Generator *pGVar8;
  element_type *this_01;
  reference ppMVar9;
  element_type *this_02;
  element_type *peVar10;
  reference __in;
  type *this_03;
  reference pvVar11;
  element_type *peVar12;
  element_type *peVar13;
  undefined4 extraout_var;
  element_type *var;
  undefined4 extraout_var_00;
  InstantiationStmt *this_04;
  element_type *port_00;
  element_type *var_00;
  StmtBlock *pSVar14;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *generators_00;
  shared_ptr<kratos::AssignStmt> sVar15;
  Generator *target_inst;
  undefined1 local_300 [16];
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> local_2b0;
  reference local_2a8;
  value_type *sink_stmt;
  shared_ptr<kratos::Stmt> local_290;
  _Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> local_280;
  reference local_278;
  value_type *source_stmt;
  enable_shared_from_this<kratos::Var> local_260;
  undefined1 local_250 [8];
  shared_ptr<kratos::Var> target_var;
  shared_ptr<kratos::Var> *target_var_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_name;
  undefined1 local_218 [8];
  value_type mapping;
  shared_ptr<kratos::Port> port;
  type *info;
  type *port_name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_true>
  local_198;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *__range3;
  Generator *child;
  enable_shared_from_this<kratos::Stmt> local_168;
  ModuleInstantiationStmt *local_158;
  ModuleInstantiationStmt *s;
  ModuleInstantiationStmt *inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *__range2;
  shared_ptr<kratos::StmtBlock> local_120;
  undefined1 local_110 [8];
  string blk_name;
  undefined1 local_e0 [24];
  shared_ptr<kratos::IterVar> *iter;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined4 local_b4;
  undefined1 local_b0 [8];
  shared_ptr<kratos::ForStmt> for_stmt;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string new_var;
  Generator *gen;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *port_mapping_local;
  vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
  *generators_local;
  
  ppMVar7 = std::
            vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
            ::operator[](generators,0);
  pGVar8 = Stmt::generator_parent(&(*ppMVar7)->super_Stmt);
  new_var.field_2._8_8_ = pGVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"i",
             (allocator<char> *)
             ((long)&for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  Generator::get_unique_variable_name((string *)local_40,pGVar8,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&for_stmt.super___shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_b4 = 0;
  local_c0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
       ::size(generators);
  iter._4_4_ = 1;
  std::make_shared<kratos::ForStmt,std::__cxx11::string_const&,int,unsigned_long,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
             (int *)local_40,(unsigned_long *)&local_b4,(int *)&local_c0);
  std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_b0);
  ForStmt::get_iter_var((ForStmt *)local_e0);
  local_e0._16_8_ = local_e0;
  this_01 = std::__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e0._16_8_);
  IterVar::set_is_gen_gar(this_01);
  uVar3 = new_var.field_2._8_8_;
  this = (shared_ptr<kratos::Stmt> *)((long)&blk_name.field_2 + 8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ForStmt,void>
            (this,(shared_ptr<kratos::ForStmt> *)local_b0);
  Generator::add_stmt((Generator *)uVar3,this);
  std::shared_ptr<kratos::Stmt>::~shared_ptr
            ((shared_ptr<kratos::Stmt> *)((long)&blk_name.field_2 + 8));
  find_common_instance_name_abi_cxx11_
            ((string *)local_110,(LiftGenVarInstanceVisitor *)generators,generators_00);
  uVar3 = new_var.field_2._8_8_;
  std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_b0);
  ForStmt::get_loop_body((ForStmt *)&__range2);
  std::shared_ptr<kratos::StmtBlock>::shared_ptr<kratos::ScopedStmtBlock,void>
            (&local_120,(shared_ptr<kratos::ScopedStmtBlock> *)&__range2);
  Generator::add_named_block((Generator *)uVar3,(string *)local_110,&local_120);
  std::shared_ptr<kratos::StmtBlock>::~shared_ptr(&local_120);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)&__range2);
  __end2 = std::
           vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
           ::begin(generators);
  inst = (ModuleInstantiationStmt *)
         std::
         vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
         ::end(generators);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<kratos::ModuleInstantiationStmt_*const_*,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>
                                     *)&inst), bVar4) {
    ppMVar9 = __gnu_cxx::
              __normal_iterator<kratos::ModuleInstantiationStmt_*const_*,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>
              ::operator*(&__end2);
    local_158 = *ppMVar9;
    s = local_158;
    this_02 = std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_b0);
    std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_168);
    ForStmt::add_genvar_stmt(this_02,(shared_ptr<kratos::Stmt> *)&local_168);
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&local_168);
    uVar3 = new_var.field_2._8_8_;
    std::enable_shared_from_this<kratos::Stmt>::shared_from_this
              ((enable_shared_from_this<kratos::Stmt> *)&child);
    Generator::remove_stmt((Generator *)uVar3,(shared_ptr<kratos::Stmt> *)&child);
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&child);
    pMVar2 = local_158;
    peVar10 = std::__shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
    (*(pMVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(pMVar2,peVar10);
    pGVar8 = ModuleInstantiationStmt::target(s);
    __end3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::begin(port_mapping);
    local_198._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
         ::end(port_mapping);
    while (bVar4 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_true>
                              ,&local_198), bVar4) {
      __in = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false,_true>
             ::operator*(&__end3);
      std::
      get<0ul,std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>>>>
                (__in);
      this_03 = std::
                get<1ul,std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>>>>
                          (__in);
      Generator::get_port((Generator *)&mapping.second._M_h._M_single_bucket,(string *)pGVar8);
      target_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                    ::begin(this_03);
      pvVar11 = std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_true>
                ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_true>
                             *)&target_name);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
              *)local_218,pvVar11);
      Generator::get_var((Generator *)
                         &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(string *)new_var.field_2._8_8_);
      this_00 = &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)local_250);
      bVar4 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)((long)&mapping.first.field_2 + 8));
      if (bVar4) {
        std::shared_ptr<kratos::Var>::operator=
                  ((shared_ptr<kratos::Var> *)local_250,(shared_ptr<kratos::Var> *)this_00);
      }
      else {
        peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this_00);
        std::shared_ptr<kratos::Var>::shared_ptr<kratos::IterVar,void>
                  ((shared_ptr<kratos::Var> *)&source_stmt,
                   (shared_ptr<kratos::IterVar> *)local_e0._16_8_);
        (*(peVar12->super_IRNode)._vptr_IRNode[10])(peVar12,(shared_ptr<kratos::Var> *)&source_stmt)
        ;
        std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_260);
        std::shared_ptr<kratos::Var>::operator=
                  ((shared_ptr<kratos::Var> *)local_250,(shared_ptr<kratos::Var> *)&local_260);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_260);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&source_stmt);
      }
      peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&mapping.second._M_h._M_single_bucket);
      PVar5 = Port::port_direction(peVar13);
      if (PVar5 == In) {
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&mapping.second._M_h._M_single_bucket);
        iVar6 = (*(peVar13->super_Var).super_IRNode._vptr_IRNode[0x10])();
        local_280._M_cur =
             (__node_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var,iVar6));
        local_278 = std::__detail::
                    _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                    operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
                               *)&local_280);
        uVar3 = new_var.field_2._8_8_;
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>(&local_290,local_278);
        Generator::remove_stmt((Generator *)uVar3,&local_290);
        std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_290);
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&mapping.second._M_h._M_single_bucket);
        (*(peVar13->super_Var).super_IRNode._vptr_IRNode[0x12])(peVar13,0);
        pp_Var1 = &mapping.second._M_h._M_single_bucket;
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)pp_Var1);
        var = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)pp_Var1);
        sVar15 = Var::assign((Var *)&sink_stmt,(shared_ptr<kratos::Var> *)var);
        (*(peVar13->super_Var).super_IRNode._vptr_IRNode[0x16])
                  (peVar13,&sink_stmt,
                   sVar15.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)&sink_stmt);
      }
      else {
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&mapping.second._M_h._M_single_bucket);
        iVar6 = (*(peVar13->super_Var).super_IRNode._vptr_IRNode[0xe])();
        local_2b0.super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>._M_cur =
             (_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var_00,iVar6));
        local_2a8 = std::__detail::
                    _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                    operator*(&local_2b0);
        uVar3 = new_var.field_2._8_8_;
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_2d0 + 0x10),local_2a8);
        Generator::remove_stmt((Generator *)uVar3,(shared_ptr<kratos::Stmt> *)(local_2d0 + 0x10));
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2d0 + 0x10));
        pp_Var1 = &mapping.second._M_h._M_single_bucket;
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)pp_Var1);
        peVar12 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_250);
        std::shared_ptr<kratos::Var>::shared_ptr<kratos::Port,void>
                  ((shared_ptr<kratos::Var> *)(local_2f0 + 0x10),(shared_ptr<kratos::Port> *)pp_Var1
                  );
        sVar15 = Var::assign((Var *)local_2d0,(shared_ptr<kratos::Var> *)peVar12);
        (*(peVar13->super_Var).super_IRNode._vptr_IRNode[0x15])
                  (peVar13,local_2d0,
                   sVar15.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_2d0);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_2f0 + 0x10));
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&mapping.second._M_h._M_single_bucket);
        (*(peVar13->super_Var).super_IRNode._vptr_IRNode[0x11])(peVar13,0);
      }
      this_04 = &s->super_InstantiationStmt;
      port_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                           &mapping.second._M_h._M_single_bucket);
      var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_250);
      InstantiationStmt::set_mapping(this_04,port_00,var_00);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_250);
      std::shared_ptr<kratos::Var>::~shared_ptr
                ((shared_ptr<kratos::Var> *)
                 &target_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
               *)local_218);
      std::shared_ptr<kratos::Port>::~shared_ptr
                ((shared_ptr<kratos::Port> *)&mapping.second._M_h._M_single_bucket);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_false,_true>
      ::operator++(&__end3);
    }
    std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_b0);
    ForStmt::get_loop_body((ForStmt *)local_2f0);
    pSVar14 = &std::
               __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2f0)->super_StmtBlock;
    bVar4 = StmtBlock::empty(pSVar14);
    std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::ScopedStmtBlock> *)local_2f0);
    if (bVar4) {
      std::__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<kratos::ForStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_b0);
      ForStmt::get_loop_body((ForStmt *)local_300);
      pSVar14 = &std::
                 __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_300)->super_StmtBlock;
      std::enable_shared_from_this<kratos::Stmt>::shared_from_this
                ((enable_shared_from_this<kratos::Stmt> *)&target_inst);
      StmtBlock::add_stmt(pSVar14,(shared_ptr<kratos::Stmt> *)&target_inst);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&target_inst);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_300);
    }
    pGVar8 = ModuleInstantiationStmt::target(local_158);
    std::__cxx11::string::operator=((string *)&pGVar8->instance_name,"inst");
    __gnu_cxx::
    __normal_iterator<kratos::ModuleInstantiationStmt_*const_*,_std::vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::shared_ptr<kratos::IterVar>::~shared_ptr((shared_ptr<kratos::IterVar> *)local_e0);
  std::shared_ptr<kratos::ForStmt>::~shared_ptr((shared_ptr<kratos::ForStmt> *)local_b0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void create_gen_var_instance(
        const std::vector<ModuleInstantiationStmt*>& generators,
        const std::unordered_map<std::string, PortInfo>& port_mapping) {
        auto* gen = generators[0]->generator_parent();
        // need to allocate a var name
        auto const new_var = gen->get_unique_variable_name("", "i");
        // need to create a for loop with genvar loop variable
        auto for_stmt = std::make_shared<ForStmt>(new_var, 0, generators.size(), 1);
        // set it to gen var
        auto const& iter = for_stmt->get_iter_var();
        iter->set_is_gen_gar();
        gen->add_stmt(for_stmt);
        auto blk_name = find_common_instance_name(generators);
        gen->add_named_block(blk_name, for_stmt->get_loop_body());
        for (auto* inst : generators) {
            // remove statement first
            // const cast
            auto* s = const_cast<ModuleInstantiationStmt*>(inst);
            for_stmt->add_genvar_stmt(s->shared_from_this());
            gen->remove_stmt(s->shared_from_this());
            s->set_parent(for_stmt.get());
            auto const* child = inst->target();
            // need to rewrite all the connections
            // first we remove all of the connections
            // remote_stmt will take care of the connection if it doesn't exist
            for (auto const& [port_name, info] : port_mapping) {
                auto port = child->get_port(port_name);
                // get the target_var
                auto mapping = *info.begin();
                auto const& target_name = mapping.first;
                auto const& target_var_base = gen->get_var(target_name);
                std::shared_ptr<Var> target_var;
                if (mapping.second.empty()) {
                    target_var = target_var_base;
                } else {
                    target_var = target_var_base->operator[](iter).shared_from_this();
                }
                if (port->port_direction() == PortDirection::In) {
                    auto const& source_stmt = *port->sources().begin();
                    gen->remove_stmt(source_stmt);
                    port->clear_sources(false);
                    port->add_source(port->assign(target_var));
                } else {
                    auto const& sink_stmt = *port->sinks().begin();
                    gen->remove_stmt(sink_stmt);
                    port->add_sink(target_var->assign(port));
                    port->clear_sinks(false);
                }
                inst->set_mapping(port.get(), target_var.get());
            }
            // only need one instance
            if (for_stmt->get_loop_body()->empty()) {
                for_stmt->get_loop_body()->add_stmt(inst->shared_from_this());
            }

            // name all the instance name to inst
            // remove const cast hack
            auto* target_inst = const_cast<Generator*>(s->target());
            target_inst->instance_name = "inst";
        }
    }